

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O1

void __thiscall Refal2::CLeftPartCompiler::matchRightSymbol(CLeftPartCompiler *this)

{
  TUnitType TVar1;
  TNumber number;
  CNodeType *pCVar2;
  
  pCVar2 = (this->hole->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last;
  TVar1 = (pCVar2->super_CUnit).type;
  number = (pCVar2->super_CUnit).field_1.label;
  if (TVar1 == UT_Number) {
    COperationsBuilder::AddMatchRightNumber((COperationsBuilder *)this,number);
  }
  else if (TVar1 == UT_Label) {
    COperationsBuilder::AddMatchRightLabel((COperationsBuilder *)this,number);
  }
  else {
    if (TVar1 != UT_Char) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/FunctionCompiler.cpp"
                    ,0x1c9,"void Refal2::CLeftPartCompiler::matchRightSymbol()");
    }
    COperationsBuilder::AddMatchRightChar((COperationsBuilder *)this,(TChar)number);
  }
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  return;
}

Assistant:

void CLeftPartCompiler::matchRightSymbol()
{
	CUnitNode unit = *hole->GetLast();
	switch( unit.GetType() ) {
		case UT_Char:
			COperationsBuilder::AddMatchRightChar( unit.Char() );
			break;
		case UT_Label:
			COperationsBuilder::AddMatchRightLabel( unit.Label() );
			break;
		case UT_Number:
			COperationsBuilder::AddMatchRightNumber( unit.Number() );
			break;
		default:
			assert( false );
			break;
	}
	hole->RemoveLast();
}